

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dic_adapter.c
# Opt level: O2

size_t SIMPLE_conv_string_to_letters(char *s,MAFSA_letter *l,size_t sz_l)

{
  char cVar1;
  size_t pos;
  byte bVar2;
  
  pos = 0;
  do {
    cVar1 = s[pos];
    if ((cVar1 == '\0') || (sz_l <= pos)) {
      return pos;
    }
    if (cVar1 == ' ') {
      bVar2 = 0x1c;
    }
    else if (cVar1 == '-') {
      bVar2 = 0x1a;
    }
    else if (cVar1 == '\'') {
      bVar2 = 0x1b;
    }
    else {
      bVar2 = cVar1 + 0xbf;
      if ((0x19 < bVar2) && (bVar2 = cVar1 + 0x9f, 0x19 < bVar2)) {
        return pos;
      }
    }
    l[pos] = bVar2;
    pos = pos + 1;
  } while( true );
}

Assistant:

size_t SIMPLE_conv_string_to_letters(const char *s, MAFSA_letter *l, size_t sz_l)
{
	size_t pos;
	for (pos = 0; *s && pos < sz_l; ++s, ++pos)
	{
		char c = *s;

		if ('-' == c)
		{
			l[pos] = SIMPLE_LETTER_DEFIS;
		}
		else if ('\'' == c)
		{
			l[pos] = SIMPLE_LETTER_APOSTROPHE;
		}
		else if (' ' == c)
		{
			l[pos] = SIMPLE_LETTER_SPACE;
		}
		else
		{
			if ('A' <= c && c <= 'Z')
			{
				l[pos] = c - 'A';
			}
			else if ('a' <= c && c <= 'z')
			{
				l[pos] = c - 'a';
			}
			else
			{
				break;
			}
		}
	}

	return pos;
}